

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int readMPS_sparse(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
                  double *objOffset,vector<int,_std::allocator<int>_> *Astart,
                  vector<int,_std::allocator<int>_> *Aindex,
                  vector<double,_std::allocator<double>_> *Avalue,
                  vector<double,_std::allocator<double>_> *rhs,
                  vector<double,_std::allocator<double>_> *cost,
                  vector<double,_std::allocator<double>_> *lb,
                  vector<double,_std::allocator<double>_> *ub,
                  vector<int,_std::allocator<int>_> *integerColumn)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  reference pvVar8;
  reference pvVar9;
  uint *in_RCX;
  uint *in_R8;
  size_type in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  vector<int,_std::allocator<int>_> *in_stack_00000048;
  int c_n_2;
  int r_n_1;
  int c_n_1;
  int c_n;
  int r_n;
  int nwNumNz;
  int numNz;
  int nwNumCol;
  int nwNumRow;
  int *in_stack_000000e8;
  int rtCd;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> colUpper;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colCost;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *__new_size;
  vector<double,_std::allocator<double>_> *this_01;
  int local_118;
  int local_114;
  int local_10c;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  uint *local_58;
  uint *local_50;
  int local_34;
  
  __new_size = &local_78;
  local_58 = in_R8;
  local_50 = in_RCX;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5df7);
  this_01 = &local_90;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5e07);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5e17);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5e27);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5e3c);
  this = in_stack_00000010;
  this_00 = in_stack_00000020;
  local_34 = readMPS((char *)rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,
                     rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (int)rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                     (int *)rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                     (int *)rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,in_stack_000000e8,
                     colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (vector<int,_std::allocator<int>_> *)
                     colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (vector<int,_std::allocator<int>_> *)
                     colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     (vector<double,_std::allocator<double>_> *)
                     colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (vector<double,_std::allocator<double>_> *)
                     colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (vector<double,_std::allocator<double>_> *)
                     colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     (vector<double,_std::allocator<double>_> *)
                     colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (vector<double,_std::allocator<double>_> *)
                     colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (vector<double,_std::allocator<double>_> *)
                     colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     (vector<int,_std::allocator<int>_> *)objSense);
  if (local_34 == 0) {
    uVar2 = *local_50;
    uVar3 = *local_58;
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
                                (long)(int)uVar3);
    printf("readMPS_sparse: Model has %d rows, %d columns and %d nonzeros\n",(ulong)uVar2,
           (ulong)uVar3,(ulong)*puVar7);
    uVar2 = *local_50;
    uVar3 = *local_58;
    uVar4 = *local_50;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_00000010,(long)(int)*local_58)
    ;
    iVar6 = *pvVar8;
    uVar5 = *local_50;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::assign
              (this,in_stack_00000008,(value_type_conflict1 *)0x1c60a7);
    std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
    for (local_10c = 0; local_10c < (int)*local_50; local_10c = local_10c + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
                          (long)(int)(*local_58 + local_10c));
      *pvVar8 = iVar6 + local_10c;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_00000018,(long)(iVar6 + local_10c));
      *pvVar8 = local_10c;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000020,(long)(iVar6 + local_10c));
      *pvVar9 = 1.0;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
                        (long)(int)(uVar3 + uVar4));
    *pvVar8 = iVar6 + uVar5;
    for (local_114 = 0; local_114 < (int)*local_58; local_114 = local_114 + 1) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(long)local_114);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000030,(long)local_114);
      *pvVar9 = vVar1;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_114);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000038,(long)local_114);
      *pvVar9 = vVar1;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,(long)local_114);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000040,(long)local_114);
      *pvVar9 = vVar1;
    }
    for (local_118 = 0; local_118 < (int)*local_50; local_118 = local_118 + 1) {
      iVar6 = *local_58 + local_118;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000030,(long)iVar6);
      *pvVar9 = 0.0;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,(long)local_118);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000038,(long)iVar6);
      *pvVar9 = -vVar1;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_c0,(long)local_118);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000040,(long)iVar6);
      *pvVar9 = -vVar1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000048,(long)iVar6);
      *pvVar8 = 0;
    }
    *local_50 = uVar2;
    *local_58 = uVar3 + uVar4;
    local_34 = 0;
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return local_34;
}

Assistant:

int readMPS_sparse(const char *filename, int mxNumRow, int mxNumCol,
		   int& numRow, int& numCol, int& objSense, double& objOffset,
		   vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
		   vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		   vector<int>& integerColumn) {
  vector<double> colCost;
  vector<double> colLower;
  vector<double> colUpper;
  vector<double> rowLower;
  vector<double> rowUpper;

  int rtCd = readMPS(filename, mxNumRow, mxNumCol,
		     numRow, numCol, objSense, objOffset,
		     Astart,  Aindex, Avalue,
		     colCost, colLower, colUpper,
		     rowLower, rowUpper,
		     integerColumn);
  if (rtCd) return rtCd;
    
#ifdef JAJH_dev
  printf("readMPS_sparse: Model has %d rows, %d columns and %d nonzeros\n", numRow, numCol, Astart[numCol]);
#endif
  //Convert
  //   c^Tx st L <= Ax <= U l <= x <= u
  //to
  //   [c^T 0]x st [A I]x=0 [l -U] <= x <= [u -L]
  //
  int nwNumRow = numRow;
  int nwNumCol = numCol + numRow;
  int numNz = Astart[numCol];
  int nwNumNz = numNz + numRow;
  Astart.resize(nwNumCol+1);
  Aindex.resize(nwNumNz);
  Avalue.resize(nwNumNz);
  rhs.assign(nwNumRow, 0);
  cost.resize(nwNumCol);
  lb.resize(nwNumCol);
  ub.resize(nwNumCol);
  integerColumn.resize(nwNumCol);
  
  for (int r_n=0; r_n<numRow; r_n++) {
    int c_n = numCol+r_n;
    Astart[c_n] = numNz + r_n;
    Aindex[numNz+r_n] = r_n;
    Avalue[numNz+r_n] = 1;
  }
  Astart[nwNumCol] = nwNumNz;
  for (int c_n=0; c_n<numCol; c_n++) {
    cost[c_n] = colCost[c_n];
    lb[c_n] = colLower[c_n];
    ub[c_n] = colUpper[c_n];
  }
  
  for (int r_n=0; r_n<numRow; r_n++) {
    int c_n = numCol+r_n;
    cost[c_n] = 0;
    lb[c_n] = -rowUpper[r_n];
    ub[c_n] = -rowLower[r_n];
    integerColumn[c_n] = 0;
  }
  numRow = nwNumRow;
  numCol = nwNumCol;
  return 0;
}